

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Fc fc)

{
  uint uVar1;
  Imu<4> local_28 [2];
  Dn local_20;
  Imu<4> local_1c;
  StrWriter *local_18;
  StrWriter *this_local;
  Fc fc_local;
  
  uVar1 = (uint)fc.raw >> 3 & 3;
  local_18 = this;
  this_local._4_4_ = fc.raw;
  if (uVar1 == 0) {
    if (fc.raw == 0) {
      operator<<(this);
      return this;
    }
    if (fc.raw == 1) {
      operator<<(this);
      return this;
    }
  }
  else {
    if (uVar1 == 1) {
      Dn::Dn(&local_20,fc.raw & 7);
      operator<<(this,local_20);
      return this;
    }
    if (uVar1 == 2) {
      Imu<4>::Imu(&local_1c,fc.raw & 7);
      operator<<(this,local_1c);
      return this;
    }
  }
  Imu<4>::Imu(local_28,fc.raw & 0xf);
  operator<<(this,local_28[0]);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Fc fc)
{
    // 10XXX — Function code is specified as bits XXX
    // 01DDD — Function code is specified as bits 2–0 of data register DDD
    // 00000 — Function code is specified as source function code register
    // 00001 — Function code is specified as destination function code register

    switch (fc.raw >> 3 & 0b11) {

        case 0b10:  *this << Imu(fc.raw & 0b111); break;
        case 0b01:  *this << Dn(fc.raw & 0b111); break;

        case 0b00:

            if (fc.raw == 0) { *this << Sfc(); break; }
            if (fc.raw == 1) { *this << Dfc(); break; }
            [[fallthrough]];

        default:    *this << Imu(fc.raw & 0b1111);
    }

    return *this;
}